

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

bool __thiscall wallet::CWallet::UnlockAllCoins(CWallet *this)

{
  _Rb_tree_header *p_Var1;
  WalletDatabase *pWVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  long in_FS_OFFSET;
  WalletBatch local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pWVar2 = (this->m_database)._M_t.
           super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
           .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
  if (pWVar2 == (WalletDatabase *)0x0) {
    __assert_fail("static_cast<bool>(m_database)",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                  ,0x1be,"virtual WalletDatabase &wallet::CWallet::GetDatabase() const");
  }
  (*pWVar2->_vptr_WalletDatabase[0xe])(&local_40,pWVar2,1);
  p_Var4 = (this->setLockedCoins)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->setLockedCoins)._M_t._M_impl.super__Rb_tree_header;
  bVar5 = true;
  local_40.m_database = pWVar2;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    do {
      bVar3 = WalletBatch::EraseLockedUTXO(&local_40,(COutPoint *)(p_Var4 + 1));
      bVar5 = (bool)(bVar5 & bVar3);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  std::
  _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
  ::clear(&(this->setLockedCoins)._M_t);
  if ((_Head_base<0UL,_wallet::DatabaseBatch_*,_false>)
      local_40.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
      (_Head_base<0UL,_wallet::DatabaseBatch_*,_false>)0x0) {
    (*(*(_func_int ***)
        local_40.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::UnlockAllCoins()
{
    AssertLockHeld(cs_wallet);
    bool success = true;
    WalletBatch batch(GetDatabase());
    for (auto it = setLockedCoins.begin(); it != setLockedCoins.end(); ++it) {
        success &= batch.EraseLockedUTXO(*it);
    }
    setLockedCoins.clear();
    return success;
}